

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O3

string * __thiscall
QUtil::qpdf_time_to_iso8601_abi_cxx11_(string *__return_storage_ptr__,QUtil *this,QPDFTime *qtm)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  ulong *puVar4;
  size_type *psVar5;
  uint uVar6;
  ulong uVar7;
  undefined8 uVar8;
  int in_R8D;
  int iVar9;
  long lVar10;
  size_type sVar11;
  string tz_offset;
  long *local_250;
  undefined8 local_248;
  long local_240;
  undefined8 uStack_238;
  ulong *local_230;
  long local_228;
  ulong local_220;
  long lStack_218;
  string local_210;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  long local_1a8;
  ulong local_1a0;
  long lStack_198;
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined8 uStack_178;
  long *local_170;
  undefined8 local_168;
  long local_160;
  undefined8 uStack_158;
  long *local_150;
  undefined8 local_148;
  long local_140;
  undefined8 uStack_138;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  undefined1 *local_110;
  undefined8 local_108;
  undefined1 local_100;
  undefined7 uStack_ff;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_108 = 0;
  local_100 = 0;
  uVar6 = *(uint *)(this + 0x18);
  local_110 = &local_100;
  if (uVar6 == 0) {
    iVar9 = 1;
    std::__cxx11::string::_M_replace((ulong)&local_110,0,(char *)0x0,0x2604ae);
  }
  else {
    if ((int)uVar6 < 0) {
      std::__cxx11::string::append((char *)&local_110);
      uVar6 = -uVar6;
    }
    else {
      std::__cxx11::string::append((char *)&local_110);
    }
    int_to_string_base_abi_cxx11_(&local_1f0,(QUtil *)((ulong)uVar6 / 0x3c),10,2,in_R8D);
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    puVar4 = (ulong *)(plVar2 + 2);
    if ((ulong *)*plVar2 == puVar4) {
      local_220 = *puVar4;
      lStack_218 = plVar2[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *puVar4;
      local_230 = (ulong *)*plVar2;
    }
    local_228 = plVar2[1];
    *plVar2 = (long)puVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    int_to_string_base_abi_cxx11_(&local_210,(QUtil *)(ulong)(uVar6 % 0x3c),10,2,in_R8D);
    uVar7 = 0xf;
    if (local_230 != &local_220) {
      uVar7 = local_220;
    }
    if (uVar7 < local_210._M_string_length + local_228) {
      uVar8 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        uVar8 = local_210.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar8 < local_210._M_string_length + local_228) goto LAB_0023f8c7;
      lVar10 = local_228;
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_230);
      iVar9 = (int)lVar10;
    }
    else {
LAB_0023f8c7:
      lVar10 = local_228;
      puVar3 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_210._M_dataplus._M_p)
      ;
      iVar9 = (int)lVar10;
    }
    local_250 = &local_240;
    plVar2 = puVar3 + 2;
    if ((long *)*puVar3 == plVar2) {
      local_240 = *plVar2;
      uStack_238 = puVar3[3];
    }
    else {
      local_240 = *plVar2;
      local_250 = (long *)*puVar3;
    }
    local_248 = puVar3[1];
    *puVar3 = plVar2;
    puVar3[1] = 0;
    *(undefined1 *)plVar2 = 0;
    std::__cxx11::string::_M_append((char *)&local_110,(ulong)local_250);
    if (local_250 != &local_240) {
      operator_delete(local_250,local_240 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    if (local_230 != &local_220) {
      operator_delete(local_230,local_220 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
  }
  int_to_string_base_abi_cxx11_(&local_50,(QUtil *)(long)*(int *)this,10,4,iVar9);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_120 = *puVar4;
    lStack_118 = plVar2[3];
    local_130 = &local_120;
  }
  else {
    local_120 = *puVar4;
    local_130 = (ulong *)*plVar2;
  }
  local_128 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_70,(QUtil *)(long)*(int *)(this + 4),10,2,iVar9);
  uVar7 = 0xf;
  if (local_130 != &local_120) {
    uVar7 = local_120;
  }
  if (uVar7 < local_70._M_string_length + local_128) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar8 = local_70.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_70._M_string_length + local_128) goto LAB_0023fa9c;
    lVar10 = local_128;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_130);
    iVar9 = (int)lVar10;
  }
  else {
LAB_0023fa9c:
    lVar10 = local_128;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_130,(ulong)local_70._M_dataplus._M_p);
    iVar9 = (int)lVar10;
  }
  local_190 = &local_180;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_180 = *plVar2;
    uStack_178 = puVar3[3];
  }
  else {
    local_180 = *plVar2;
    local_190 = (long *)*puVar3;
  }
  local_188 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_190);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_1c0 = *puVar4;
    lStack_1b8 = plVar2[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar4;
    local_1d0 = (ulong *)*plVar2;
  }
  local_1c8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_90,(QUtil *)(long)*(int *)(this + 8),10,2,iVar9);
  uVar7 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar7 = local_1c0;
  }
  if (uVar7 < local_90._M_string_length + local_1c8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_90._M_string_length + local_1c8) goto LAB_0023fbec;
    lVar10 = local_1c8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_1d0);
    iVar9 = (int)lVar10;
  }
  else {
LAB_0023fbec:
    lVar10 = local_1c8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_90._M_dataplus._M_p);
    iVar9 = (int)lVar10;
  }
  local_170 = &local_160;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_160 = *plVar2;
    uStack_158 = puVar3[3];
  }
  else {
    local_160 = *plVar2;
    local_170 = (long *)*puVar3;
  }
  local_168 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_170);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_1a0 = *puVar4;
    lStack_198 = plVar2[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *puVar4;
    local_1b0 = (ulong *)*plVar2;
  }
  local_1a8 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_b0,(QUtil *)(long)*(int *)(this + 0xc),10,2,iVar9);
  uVar7 = 0xf;
  if (local_1b0 != &local_1a0) {
    uVar7 = local_1a0;
  }
  if (uVar7 < local_b0._M_string_length + local_1a8) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      uVar8 = local_b0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_b0._M_string_length + local_1a8) goto LAB_0023fd3c;
    lVar10 = local_1a8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,(ulong)local_1b0);
    iVar9 = (int)lVar10;
  }
  else {
LAB_0023fd3c:
    lVar10 = local_1a8;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_1b0,(ulong)local_b0._M_dataplus._M_p);
    iVar9 = (int)lVar10;
  }
  local_150 = &local_140;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_140 = *plVar2;
    uStack_138 = puVar3[3];
  }
  else {
    local_140 = *plVar2;
    local_150 = (long *)*puVar3;
  }
  local_148 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_150);
  paVar1 = &local_210.field_2;
  puVar4 = (ulong *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar4) {
    local_210.field_2._M_allocated_capacity = *puVar4;
    local_210.field_2._8_8_ = plVar2[3];
    local_210._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_210.field_2._M_allocated_capacity = *puVar4;
    local_210._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_210._M_string_length = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_d0,(QUtil *)(long)*(int *)(this + 0x10),10,2,iVar9);
  uVar8 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    uVar8 = local_210.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar8 < local_d0._M_string_length + local_210._M_string_length) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar8 = local_d0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < local_d0._M_string_length + local_210._M_string_length) goto LAB_0023fe77;
    sVar11 = local_210._M_string_length;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_d0,0,(char *)0x0,(ulong)local_210._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  else {
LAB_0023fe77:
    sVar11 = local_210._M_string_length;
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_d0._M_dataplus._M_p);
    iVar9 = (int)sVar11;
  }
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  psVar5 = puVar3 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_1f0.field_2._M_allocated_capacity = *psVar5;
    local_1f0.field_2._8_8_ = puVar3[3];
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar5;
    local_1f0._M_dataplus._M_p = (pointer)*puVar3;
  }
  local_1f0._M_string_length = puVar3[1];
  *puVar3 = psVar5;
  puVar3[1] = 0;
  *(undefined1 *)psVar5 = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  puVar4 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar4) {
    local_220 = *puVar4;
    lStack_218 = plVar2[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *puVar4;
    local_230 = (ulong *)*plVar2;
  }
  local_228 = plVar2[1];
  *plVar2 = (long)puVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  int_to_string_base_abi_cxx11_(&local_f0,(QUtil *)(long)*(int *)(this + 0x14),10,2,iVar9);
  uVar7 = 0xf;
  if (local_230 != &local_220) {
    uVar7 = local_220;
  }
  if (uVar7 < local_f0._M_string_length + local_228) {
    uVar8 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar8 = local_f0.field_2._M_allocated_capacity;
    }
    if (local_f0._M_string_length + local_228 <= (ulong)uVar8) {
      puVar3 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_230);
      goto LAB_0023ffbb;
    }
  }
  puVar3 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_f0._M_dataplus._M_p);
LAB_0023ffbb:
  local_250 = &local_240;
  plVar2 = puVar3 + 2;
  if ((long *)*puVar3 == plVar2) {
    local_240 = *plVar2;
    uStack_238 = puVar3[3];
  }
  else {
    local_240 = *plVar2;
    local_250 = (long *)*puVar3;
  }
  local_248 = puVar3[1];
  *puVar3 = plVar2;
  puVar3[1] = 0;
  *(undefined1 *)plVar2 = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_250,(ulong)local_110);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar10 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar10;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != &local_220) {
    operator_delete(local_230,local_220 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar1) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_150 != &local_140) {
    operator_delete(local_150,local_140 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130,local_120 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110,CONCAT71(uStack_ff,local_100) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::qpdf_time_to_iso8601(QPDFTime const& qtm)
{
    std::string tz_offset;
    int t = qtm.tz_delta;
    if (t == 0) {
        tz_offset = "Z";
    } else {
        if (t < 0) {
            t = -t;
            tz_offset += "+";
        } else {
            tz_offset += "-";
        }
        tz_offset += QUtil::int_to_string(t / 60, 2) + ":" + QUtil::int_to_string(t % 60, 2);
    }
    return (
        QUtil::int_to_string(qtm.year, 4) + "-" + QUtil::int_to_string(qtm.month, 2) + "-" +
        QUtil::int_to_string(qtm.day, 2) + "T" + QUtil::int_to_string(qtm.hour, 2) + ":" +
        QUtil::int_to_string(qtm.minute, 2) + ":" + QUtil::int_to_string(qtm.second, 2) +
        tz_offset);
}